

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O0

void __thiscall
utObjImportExport_obj_import_test_Test::TestBody(utObjImportExport_obj_import_test_Test *this)

{
  Importer *this_00;
  aiMesh *this_01;
  void *pvVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  bool bVar3;
  size_t pLength;
  char *pcVar4;
  char *in_R9;
  uint local_bc;
  undefined1 local_b8 [4];
  uint i;
  AssertHelper local_98;
  Message local_90;
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_;
  SceneDiffer differ;
  Message local_50 [3];
  void *local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  aiScene *expected;
  aiScene *scene;
  utObjImportExport_obj_import_test_Test *this_local;
  
  pcVar4 = ObjModel;
  this_00 = (this->super_utObjImportExport).m_im;
  scene = (aiScene *)this;
  pLength = strlen(ObjModel);
  expected = Assimp::Importer::ReadFileFromMemory(this_00,pcVar4,pLength,0,"");
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       utObjImportExport::createScene(&this->super_utObjImportExport);
  local_38 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)local_30,"nullptr","scene",&local_38,&expected);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar3) {
    testing::Message::Message(local_50);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &differ.m_diffs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0xec,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &differ.m_diffs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_50);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &differ.m_diffs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  Assimp::SceneDiffer::SceneDiffer((SceneDiffer *)&gtest_ar_.message_);
  local_81 = Assimp::SceneDiffer::isEqual
                       ((SceneDiffer *)&gtest_ar_.message_,(aiScene *)gtest_ar.message_.ptr_,
                        expected);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar3) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_80,
               (AssertionResult *)"differ.isEqual( expected, scene )","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0xef,pcVar4);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)local_b8);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  Assimp::SceneDiffer::showReport((SceneDiffer *)&gtest_ar_.message_);
  Assimp::Importer::FreeScene((this->super_utObjImportExport).m_im);
  for (local_bc = 0; local_bc < *(uint *)&(gtest_ar.message_.ptr_)->field_2; local_bc = local_bc + 1
      ) {
    this_01 = *(aiMesh **)
               (*(long *)((long)&(gtest_ar.message_.ptr_)->field_2 + 8) + (ulong)local_bc * 8);
    if (this_01 != (aiMesh *)0x0) {
      aiMesh::~aiMesh(this_01);
      operator_delete(this_01);
    }
  }
  pvVar1 = *(void **)((long)&(gtest_ar.message_.ptr_)->field_2 + 8);
  if (pvVar1 != (void *)0x0) {
    operator_delete__(pvVar1);
  }
  *(undefined8 *)((long)&(gtest_ar.message_.ptr_)->field_2 + 8) = 0;
  if ((void *)gtest_ar.message_.ptr_[1]._M_string_length != (void *)0x0) {
    operator_delete__((void *)gtest_ar.message_.ptr_[1]._M_string_length);
  }
  sVar2.ptr_ = gtest_ar.message_.ptr_;
  gtest_ar.message_.ptr_[1]._M_string_length = 0;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    aiScene::~aiScene((aiScene *)gtest_ar.message_.ptr_);
    operator_delete(sVar2.ptr_);
  }
  Assimp::SceneDiffer::~SceneDiffer((SceneDiffer *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F( utObjImportExport, obj_import_test ) {
    const aiScene *scene = m_im->ReadFileFromMemory( (void*) ObjModel, strlen(ObjModel), 0 );
    aiScene *expected = createScene();
    EXPECT_NE( nullptr, scene );

    SceneDiffer differ;
    EXPECT_TRUE( differ.isEqual( expected, scene ) );
    differ.showReport();

    m_im->FreeScene();
    for(unsigned int i = 0; i < expected->mNumMeshes; ++i)
    {
        delete expected->mMeshes[i];
    }
    delete[] expected->mMeshes;
    expected->mMeshes = nullptr;
    delete[] expected->mMaterials;
    expected->mMaterials = nullptr;
    delete expected;
}